

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

bool __thiscall
node::CBlockIndexWorkComparator::operator()
          (CBlockIndexWorkComparator *this,CBlockIndex *pa,CBlockIndex *pb)

{
  long lVar1;
  bool bVar2;
  base_uint<256U> *in_RDX;
  base_uint<256U> *in_RSI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  bool local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = operator>(in_RDX,(base_uint<256U> *)
                           CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  if (bVar2) {
    local_9 = false;
  }
  else {
    bVar2 = ::operator<(in_RDX,(base_uint<256U> *)
                               CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    if (bVar2) {
      local_9 = true;
    }
    else if ((int)in_RSI[4].pn[3] < (int)in_RDX[4].pn[3]) {
      local_9 = false;
    }
    else if ((int)in_RDX[4].pn[3] < (int)in_RSI[4].pn[3]) {
      local_9 = true;
    }
    else if (in_RSI < in_RDX) {
      local_9 = false;
    }
    else if (in_RDX < in_RSI) {
      local_9 = true;
    }
    else {
      local_9 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool CBlockIndexWorkComparator::operator()(const CBlockIndex* pa, const CBlockIndex* pb) const
{
    // First sort by most total work, ...
    if (pa->nChainWork > pb->nChainWork) return false;
    if (pa->nChainWork < pb->nChainWork) return true;

    // ... then by earliest time received, ...
    if (pa->nSequenceId < pb->nSequenceId) return false;
    if (pa->nSequenceId > pb->nSequenceId) return true;

    // Use pointer address as tie breaker (should only happen with blocks
    // loaded from disk, as those all have id 0).
    if (pa < pb) return false;
    if (pa > pb) return true;

    // Identical blocks.
    return false;
}